

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> * __thiscall
jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
as_string<std::allocator<wchar_t>>
          (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *this,
          allocator<wchar_t> *alloc)

{
  error_code ec_00;
  json_storage_kind jVar1;
  bool bVar2;
  wchar_t *pwVar3;
  size_type sVar4;
  undefined8 uVar5;
  basic_json_visitor<wchar_t> *visitor;
  allocator *in_RDX;
  error_category *in_RSI;
  ser_error *in_RDI;
  basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>
  encoder_1;
  basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>
  encoder;
  value_converter<jsoncons::byte_string_view,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_void>
  converter;
  error_code ec;
  type *s;
  basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>
  *in_stack_fffffffffffffc20;
  basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>
  *this_00;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffc28;
  ser_error *psVar6;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffc60;
  string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_398 [2];
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffc78;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffc80;
  error_code *in_stack_fffffffffffffcb0;
  semantic_tag in_stack_fffffffffffffcbf;
  byte_string_view *in_stack_fffffffffffffcc0;
  value_converter<jsoncons::byte_string_view,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_void>
  *in_stack_fffffffffffffcc8;
  allocator<char> *in_stack_fffffffffffffd50;
  string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *in_stack_fffffffffffffd58;
  basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>
  *in_stack_fffffffffffffd60;
  basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>
  local_211;
  undefined1 local_89;
  error_code local_88 [3];
  undefined1 local_4a;
  string_view_type local_48;
  string_view_type local_38;
  int local_28;
  undefined4 uStack_24;
  allocator<wchar_t> *in_stack_ffffffffffffffe0;
  
  psVar6 = in_RDI;
  std::error_code::error_code((error_code *)in_stack_fffffffffffffc20);
  jVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::storage_kind
                    ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)in_RSI);
  visitor = (basic_json_visitor<wchar_t> *)(ulong)(byte)(jVar1 - short_str);
  switch(visitor) {
  case (basic_json_visitor<wchar_t> *)0x0:
  case (basic_json_visitor<wchar_t> *)0x8:
    local_38 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                         (in_stack_fffffffffffffc80);
    pwVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::data(&local_38);
    local_48 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                         (in_stack_fffffffffffffc80);
    sVar4 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length(&local_48);
    std::__cxx11::wstring::wstring((wstring *)in_RDI,pwVar3,sVar4,in_RDX);
    break;
  case (basic_json_visitor<wchar_t> *)0x1:
    cast<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::json_const_reference_storage>
              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               in_stack_fffffffffffffc20);
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::
    json_const_reference_storage::value((json_const_reference_storage *)0x619e0f);
    as_string<std::allocator<wchar_t>>
              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)in_RDX,
               in_stack_ffffffffffffffe0);
    break;
  case (basic_json_visitor<wchar_t> *)0x2:
    cast<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::json_reference_storage>
              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               in_stack_fffffffffffffc20);
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::json_reference_storage::
    value((json_reference_storage *)0x619e3b);
    as_string<std::allocator<wchar_t>>
              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)in_RDX,
               in_stack_ffffffffffffffe0);
    break;
  default:
    std::__cxx11::wstring::wstring((wstring *)in_RDI,in_RDX);
    string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::string_sink(local_398,(container_type *)in_RDI);
    std::allocator<char>::allocator();
    basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>
    ::basic_compact_json_encoder
              (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc67);
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::dump
              (in_stack_fffffffffffffc60,visitor);
    basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>
    ::~basic_compact_json_encoder(in_stack_fffffffffffffc20);
    break;
  case (basic_json_visitor<wchar_t> *)0x5:
    value_converter<jsoncons::byte_string_view,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_void>
    ::value_converter((value_converter<jsoncons::byte_string_view,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_void>
                       *)in_RDI);
    local_4a = 0;
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::as_byte_string_view
              (in_stack_fffffffffffffc78);
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::tag
              (in_stack_fffffffffffffc28);
    value_converter<jsoncons::byte_string_view,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_void>
    ::convert<wchar_t>(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbf
                       ,in_stack_fffffffffffffcb0);
    bVar2 = std::error_code::operator_cast_to_bool((error_code *)&stack0xffffffffffffffd8);
    if (bVar2) {
      uVar5 = __cxa_allocate_exception(0x58);
      local_88[0]._M_value = local_28;
      local_88[0]._4_4_ = uStack_24;
      ec_00._M_cat = in_RSI;
      ec_00._0_8_ = psVar6;
      ser_error::ser_error(in_RDI,ec_00);
      __cxa_throw(uVar5,&ser_error::typeinfo,ser_error::~ser_error);
    }
    local_4a = 1;
    value_converter<jsoncons::byte_string_view,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_void>
    ::~value_converter((value_converter<jsoncons::byte_string_view,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_void>
                        *)0x619cc4);
    break;
  case (basic_json_visitor<wchar_t> *)0x7:
    local_89 = 0;
    std::__cxx11::wstring::wstring((wstring *)in_RDI,in_RDX);
    string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::string_sink((string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                   *)((long)&local_211.super_basic_json_visitor<wchar_t>._vptr_basic_json_visitor +
                     1),(container_type *)in_RDI);
    this_00 = &local_211;
    std::allocator<char>::allocator();
    basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>
    ::basic_compact_json_encoder
              (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
    std::allocator<char>::~allocator((allocator<char> *)&local_211);
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::dump
              (in_stack_fffffffffffffc60,visitor);
    basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>
    ::~basic_compact_json_encoder(this_00);
  }
  return (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)psVar6;
}

Assistant:

std::basic_string<char_type,char_traits_type,SAllocator> as_string(const SAllocator& alloc) const 
        {
            using string_type2 = std::basic_string<char_type,char_traits_type,SAllocator>;

            std::error_code ec;
            switch (storage_kind())
            {
                case json_storage_kind::short_str:
                case json_storage_kind::long_str:
                {
                    return string_type2(as_string_view().data(),as_string_view().length(),alloc);
                }
                case json_storage_kind::byte_str:
                {
                    value_converter<byte_string_view,string_type2> converter;
                    auto s = converter.convert(as_byte_string_view(), tag(), ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        JSONCONS_THROW(ser_error(ec));
                    }
                    return s;
                }
                case json_storage_kind::array:
                {
                    string_type2 s(alloc);
                    {
                        basic_compact_json_encoder<char_type,jsoncons::string_sink<string_type2>> encoder(s);
                        dump(encoder);
                    }
                    return s;
                }
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().as_string(alloc);
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().as_string(alloc);
                default:
                {
                    string_type2 s(alloc);
                    basic_compact_json_encoder<char_type,jsoncons::string_sink<string_type2>> encoder(s);
                    dump(encoder);
                    return s;
                }
            }
        }